

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketGlobalData::QSslSocketGlobalData(QSslSocketGlobalData *this)

{
  QExplicitlySharedDataPointer<QSslConfigurationPrivate> *this_00;
  QSslConfigurationPrivate *pQVar1;
  long in_RDI;
  QSslConfigurationPrivate *in_stack_ffffffffffffffc8;
  QSslConfigurationPrivate *in_stack_ffffffffffffffe0;
  
  QMutex::QMutex((QMutex *)0x3ad8bc);
  QList<QSslCipher>::QList((QList<QSslCipher> *)0x3ad8ca);
  QList<QSslEllipticCurve>::QList((QList<QSslEllipticCurve> *)0x3ad8d8);
  this_00 = (QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)(in_RDI + 0x38);
  operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate(in_stack_ffffffffffffffe0);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::QExplicitlySharedDataPointer
            (this_00,in_stack_ffffffffffffffc8);
  pQVar1 = (QSslConfigurationPrivate *)(in_RDI + 0x40);
  operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate(pQVar1);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::QExplicitlySharedDataPointer
            (this_00,in_stack_ffffffffffffffc8);
  pQVar1 = QExplicitlySharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3ad94e);
  pQVar1->protocol = DtlsV1_2OrLater;
  return;
}

Assistant:

QSslSocketGlobalData()
        : config(new QSslConfigurationPrivate),
          dtlsConfig(new QSslConfigurationPrivate)
    {
#if QT_CONFIG(dtls)
        dtlsConfig->protocol = QSsl::DtlsV1_2OrLater;
#endif // dtls
    }